

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash_test.cc
# Opt level: O0

int main(void)

{
  __type _Var1;
  __pid_t __pid;
  undefined8 uVar2;
  int i_2;
  string value;
  RetCode ret_2;
  Engine *engine_1;
  int res;
  RetCode ret_1;
  int i_1;
  RetCode ret;
  Engine *engine;
  pid_t fpid;
  int i;
  string engine_path;
  string *in_stack_fffffffffffffd88;
  allocator *paVar3;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  uint in_stack_fffffffffffffdb0;
  RetCode in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd8;
  long *plVar5;
  allocator local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [20];
  int local_194;
  string local_190 [36];
  RetCode local_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  int local_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [20];
  int local_134;
  int local_130;
  RetCode local_12c;
  long *local_128;
  __pid_t local_11c;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [36];
  int local_ac;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  string local_60 [55];
  allocator local_29;
  string local_28 [36];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,"======================= crash test ============================",&local_29);
  printf_((string *)0x103652);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"./data/test-",&local_81);
  asm_rdtsc();
  std::__cxx11::to_string((unsigned_long_long)in_stack_fffffffffffffdc8);
  std::operator+(in_stack_fffffffffffffdc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  uVar2 = std::__cxx11::string::c_str();
  printf("open engine_path: %s\n",uVar2);
  for (local_ac = 0; local_ac < 30000; local_ac = local_ac + 1) {
    gen_random((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,k,&local_f1);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    std::operator+(in_stack_fffffffffffffdc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    std::__cxx11::string::operator=((string *)(ks_abi_cxx11_ + (long)local_ac * 0x20),local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    gen_random((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    std::__cxx11::string::operator=((string *)(vs_abi_cxx11_ + (long)local_ac * 0x20),v);
  }
  signal(10,handler);
  local_11c = fork();
  if (local_11c == 0) {
    local_128 = (long *)0x0;
    local_12c = polar_race::Engine::Open
                          ((string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           (Engine **)in_stack_fffffffffffffd88);
    if (local_12c != kSucc) {
      __assert_fail("ret == kSucc",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x32,"int main()");
    }
    local_12c = 0;
    for (local_130 = 0; local_130 < 30000; local_130 = local_130 + 1) {
      plVar5 = local_128;
      polar_race::PolarString::PolarString
                ((PolarString *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88);
      polar_race::PolarString::PolarString
                ((PolarString *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88);
      local_134 = (**(code **)(*plVar5 + 0x10))(plVar5,local_148,local_158);
      if (local_134 != 0) {
        __assert_fail("ret == kSucc",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x35,"int main()");
      }
      if (local_130 == 10000) {
        __pid = getppid();
        kill(__pid,10);
      }
    }
    if (local_128 != (long *)0x0) {
      (**(code **)(*local_128 + 8))();
    }
  }
  else {
    if (local_11c < 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,99,"int main()");
    }
    do {
    } while (((need_kill ^ 0xffU) & 1) != 0);
    local_15c = kill(local_11c,9);
    if (local_15c != 0) {
      __assert_fail("res == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x41,"int main()");
    }
    waitpid(local_11c,&local_15c,0);
    if (local_15c < 1) {
      __assert_fail("res > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x44,"int main()");
    }
    local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_16c = polar_race::Engine::Open
                          ((string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           (Engine **)in_stack_fffffffffffffd88);
    if (local_16c != kSucc) {
      __assert_fail("ret == kSucc",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                    ,0x49,"int main()");
    }
    std::__cxx11::string::string(local_190);
    for (local_194 = 0; pbVar4 = local_168, local_194 < 0x2711; local_194 = local_194 + 1) {
      polar_race::PolarString::PolarString
                ((PolarString *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88);
      in_stack_fffffffffffffdb4 = (**(code **)(*(long *)pbVar4 + 0x18))(pbVar4,local_1a8,local_190);
      local_16c = in_stack_fffffffffffffdb4;
      if (in_stack_fffffffffffffdb4 != kSucc) {
        __assert_fail("ret == kSucc",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x4f,"int main()");
      }
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (ulong)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      if (!_Var1) {
        __assert_fail("value == vs[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x50,"int main()");
      }
    }
    for (; local_194 < 30000; local_194 = local_194 + 1) {
      pbVar4 = local_168;
      polar_race::PolarString::PolarString
                ((PolarString *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88);
      local_16c = (**(code **)(*(long *)pbVar4 + 0x18))(pbVar4,local_1b8,local_190);
      if (local_16c != kSucc) {
        if (local_16c != kNotFound) {
          __assert_fail("ret == kNotFound",
                        "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                        ,0x57,"int main()");
        }
        break;
      }
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),pbVar4);
      if (!_Var1) {
        __assert_fail("value == vs[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x55,"int main()");
      }
    }
    for (; pbVar4 = local_168, local_194 < 30000; local_194 = local_194 + 1) {
      polar_race::PolarString::PolarString
                ((PolarString *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88);
      local_16c = (**(code **)(*(long *)pbVar4 + 0x18))(pbVar4,local_1c8,local_190);
      if (local_16c != 1) {
        __assert_fail("ret == kNotFound",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/crash_test.cc"
                      ,0x5e,"int main()");
      }
      in_stack_fffffffffffffd94 = 1;
      local_16c = kNotFound;
    }
    paVar3 = &local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1e8,"======================= crash test pass :) ======================",paVar3)
    ;
    printf_((string *)0x103f73);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::string::~string(local_190);
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_60);
  return local_4;
}

Assistant:

int main() {

    printf_( "======================= crash test ============================");
    std::string engine_path =
        std::string("./data/test-") + std::to_string(asm_rdtsc());
    printf("open engine_path: %s\n", engine_path.c_str());

    for (int i = 0; i < KV_CNT; ++i) {
        gen_random(k, 13);
        ks[i] = std::string(k) + std::to_string(i);
        gen_random(v, 677);
        vs[i] = v;
    }

    signal(SIGUSR1, handler);
    pid_t fpid = fork();
    if (fpid == 0) { // child
        Engine *engine = NULL;
        RetCode ret = Engine::Open(engine_path, &engine);
        assert(ret == kSucc);
        for (int i = 0; i < KV_CNT; ++i) {
            RetCode ret = engine->Write(ks[i], vs[i]);
            assert(ret == kSucc);
            if (i == KV_CNT / 3) {
                kill(getppid(), SIGUSR1);
            }
        }
        delete engine;

    } else if (fpid > 0) { // me

        while (!need_kill);

        int res = kill(fpid, 9);
        assert(res == 0);
        
        waitpid(fpid, &res, 0);
        assert(res > 0);

        // re-open and check 
        Engine *engine = NULL;
        RetCode ret = Engine::Open(engine_path, &engine);
        assert(ret == kSucc);
        std::string value;

        int i = 0;
        for (; i <= KV_CNT / 3; ++i) {
            ret = engine->Read(ks[i], &value);
            assert(ret == kSucc);
            assert(value == vs[i]);
        }
        for (; i < KV_CNT; ++i) {
            ret = engine->Read(ks[i], &value);
            if (ret == kSucc) {
                assert(value == vs[i]);
            } else {
                assert(ret == kNotFound);
                break;
            }

        }
        for (; i < KV_CNT; ++i) {
            ret = engine->Read(ks[i], &value);
            assert(ret == kNotFound);
        }
        printf_( "======================= crash test pass :) " "======================");

    } else {
        assert(false);
    }

    return 0;
}